

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void luaV_objlen(lua_State *L,StkId ra,TValue *rb)

{
  undefined8 uVar1;
  Table *t;
  uint uVar2;
  int iVar3;
  undefined1 auVar4 [16];
  Table *local_58;
  Table *local_50;
  TValue *io_1;
  TValue *io;
  Table *h;
  TValue *tm;
  TValue *rb_local;
  StkId ra_local;
  lua_State *L_local;
  
  uVar2 = rb->tt_ & 0xf;
  if (uVar2 == 4) {
    uVar1 = *(undefined8 *)((rb->value_).f + 0x10);
    auVar4._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar4._0_8_ = uVar1;
    auVar4._12_4_ = 0x45300000;
    (ra->value_).n =
         (auVar4._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    ra->tt_ = 3;
  }
  else {
    if (uVar2 == 5) {
      t = (Table *)(rb->value_).f;
      if (t->metatable == (Table *)0x0) {
        local_50 = (Table *)0x0;
      }
      else {
        if ((t->metatable->flags & 0x10) == 0) {
          local_58 = (Table *)luaT_gettm(t->metatable,TM_LEN,L->l_G->tmname[4]);
        }
        else {
          local_58 = (Table *)0x0;
        }
        local_50 = local_58;
      }
      h = local_50;
      if (local_50 == (Table *)0x0) {
        iVar3 = luaH_getn(t);
        (ra->value_).n = (double)iVar3;
        ra->tt_ = 3;
        return;
      }
    }
    else {
      h = (Table *)luaT_gettmbyobj(L,rb,TM_LEN);
      if (*(int *)&h->tt == 0) {
        luaG_typeerror(L,rb,"get length of");
      }
    }
    callTM(L,(TValue *)h,rb,rb,ra,1);
  }
  return;
}

Assistant:

void luaV_objlen (lua_State *L, StkId ra, const TValue *rb) {
  const TValue *tm;
  switch (ttypenv(rb)) {
    case LUA_TTABLE: {
      Table *h = hvalue(rb);
      tm = fasttm(L, h->metatable, TM_LEN);
      if (tm) break;  /* metamethod? break switch to call it */
      setnvalue(ra, cast_num(luaH_getn(h)));  /* else primitive len */
      return;
    }
    case LUA_TSTRING: {
      setnvalue(ra, cast_num(tsvalue(rb)->len));
      return;
    }
    default: {  /* try metamethod */
      tm = luaT_gettmbyobj(L, rb, TM_LEN);
      if (ttisnil(tm))  /* no metamethod? */
        luaG_typeerror(L, rb, "get length of");
      break;
    }
  }
  callTM(L, tm, rb, rb, ra, 1);
}